

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

void __thiscall
hypermind::CompileUnit::EmitBindMethod(CompileUnit *this,Signature signature,HMBool isStatic)

{
  HMInteger operand;
  Opcode local_41;
  HMInteger index;
  HMBool isStatic_local;
  CompileUnit *this_local;
  
  this->mStackSlotNum = this->mStackSlotNum - 1;
  if (this->mFn->maxStackSlotNum < this->mStackSlotNum) {
    this->mFn->maxStackSlotNum = this->mStackSlotNum;
  }
  local_41 = BindStaticMethod;
  if (!isStatic) {
    local_41 = BindInstanceMethod;
  }
  WriteOpcode(this,local_41);
  operand = SymbolTable::EnsureFind(&this->mVM->mAllMethods,&this->mVM->mGCHeap,signature);
  WriteShortOperand(this,operand);
  return;
}

Assistant:

void EmitBindMethod(Signature signature, HMBool isStatic) {
            STACK_CHANGE(-1);
            WriteOpcode(isStatic ? Opcode::BindStaticMethod : Opcode::BindInstanceMethod);
            HMInteger index = mVM->mAllMethods.EnsureFind(&mVM->mGCHeap, signature);
            WriteShortOperand(index);
        }